

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_map_l2net_data(dlep_writer *writer,dlep_extension *ext,oonf_layer2_data *data)

{
  oonf_layer2_network_index oVar1;
  _func_int_dlep_writer_ptr_oonf_layer2_data_ptr_oonf_layer2_metadata_ptr_uint16_t_uint16_t_uint64_t
  *p_Var2;
  int iVar3;
  dlep_network_mapping *pdVar4;
  oonf_layer2_metadata *poVar5;
  ulong local_38;
  size_t i;
  dlep_network_mapping *map;
  oonf_layer2_data *data_local;
  dlep_extension *ext_local;
  dlep_writer *writer_local;
  
  local_38 = 0;
  while( true ) {
    if (ext->if_mapping_count <= local_38) {
      return 0;
    }
    pdVar4 = ext->if_mapping + local_38;
    p_Var2 = pdVar4->to_tlv;
    oVar1 = pdVar4->layer2;
    poVar5 = oonf_layer2_net_metadata_get(pdVar4->layer2);
    iVar3 = (*p_Var2)(writer,data + oVar1,poVar5,pdVar4->dlep,pdVar4->length,pdVar4->scaling);
    if (iVar3 != 0) break;
    local_38 = local_38 + 1;
  }
  return -((int)local_38 + 1);
}

Assistant:

int
dlep_writer_map_l2net_data(struct dlep_writer *writer, struct dlep_extension *ext, struct oonf_layer2_data *data) {
  struct dlep_network_mapping *map;
  size_t i;

  for (i = 0; i < ext->if_mapping_count; i++) {
    map = &ext->if_mapping[i];

    if (map->to_tlv(writer, &data[map->layer2], oonf_layer2_net_metadata_get(map->layer2), map->dlep, map->length, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}